

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O3

bool check_equal(vector<float,_std::allocator<float>_> *result,
                vector<float,_std::allocator<float>_> *expected)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  
  pfVar2 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)pfVar3 - (long)pfVar2 >> 2;
  pfVar4 = (expected->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar7 == (long)(expected->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar4 >> 2) {
    bVar6 = true;
    if (pfVar3 != pfVar2) {
      uVar5 = 0;
      do {
        fVar1 = pfVar4[uVar5];
        if (1e-05 < ABS(pfVar2[uVar5] - fVar1)) {
          printf("result[%d] %f != %f expected[%d]\n",(double)pfVar2[uVar5],(double)fVar1,
                 uVar5 & 0xffffffff);
          return false;
        }
        uVar5 = uVar5 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != uVar5);
    }
  }
  else {
    bVar6 = false;
    printf("result.size() = %d, expected.size() = %d\n");
  }
  return bVar6;
}

Assistant:

bool check_equal(const std::vector<float> & result, const std::vector<float> & expected) {
    if (result.size() != expected.size()) {
        printf("result.size() = %d, expected.size() = %d\n", (int)result.size(), (int)expected.size());
        return false;
    }
    for (int i = 0; i < result.size(); i++) {
        if(std::abs(result[i] - expected[i]) > 1e-5) {
            printf("result[%d] %f != %f expected[%d]\n", i, result[i], expected[i], i);
            return false;
        }
    }
    return true;
}